

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::instantiate(ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  pointer puVar1;
  Global *global;
  string_view name;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar2;
  Literals local_d8;
  SmallVector<wasm::Literal,_1UL> local_a0;
  undefined1 auStack_68 [8];
  Literals arguments;
  
  (*this->externalInterface->_vptr_ExternalInterface[3])
            (this->externalInterface,&this->globals,this->wasm);
  puVar2 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])this;
  if (puVar2 != puVar1) {
    do {
      global = (puVar2->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if ((global->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        instantiate::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)auStack_68,global);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  (*this->externalInterface->_vptr_ExternalInterface[2])(this->externalInterface,this->wasm,this);
  initializeTableContents(this);
  initializeMemoryContents(this);
  if ((this->wasm->start).super_IString.str._M_str != (char *)0x0) {
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
    ._M_str = (char *)0x0;
    auStack_68 = (undefined1  [8])0x0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    name = (this->wasm->start).super_IString.str;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_a0,(SmallVector<wasm::Literal,_1UL> *)auStack_68);
    callFunction(&local_d8,this,(Name)name,(Literals *)&local_a0);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              (&local_d8.super_SmallVector<wasm::Literal,_1UL>.flexible);
    ::wasm::Literal::~Literal(local_d8.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_a0.flexible);
    ::wasm::Literal::~Literal(local_a0.fixed._M_elems);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    ::wasm::Literal::~Literal((Literal *)&arguments);
  }
  return;
}

Assistant:

void instantiate() {
    // import globals from the outside
    externalInterface->importGlobals(globals, wasm);
    // generate internal (non-imported) globals
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      globals[global->name] = self()->visit(global->init).values;
    });

    // initialize the rest of the external interface
    externalInterface->init(wasm, *self());

    initializeTableContents();
    initializeMemoryContents();

    // run start, if present
    if (wasm.start.is()) {
      Literals arguments;
      callFunction(wasm.start, arguments);
    }
  }